

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fourier_ooura.cc
# Opt level: O0

void __thiscall
webrtc::RealFourierOoura::Forward(RealFourierOoura *this,float *src,complex<float> *dest)

{
  size_t n;
  complex<float> *a;
  pointer ip;
  pointer w;
  float fVar1;
  complex<float> local_38;
  complex<float> local_30;
  complex<float> *local_28;
  float *dest_float;
  complex<float> *dest_local;
  float *src_local;
  RealFourierOoura *this_local;
  
  local_28 = dest;
  dest_float = (float *)dest;
  dest_local = (complex<float> *)src;
  src_local = (float *)this;
  std::copy<float_const*,float*>(src,src + this->length_,(float *)dest);
  a = local_28;
  n = this->length_;
  ip = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get(&this->work_ip_)
  ;
  w = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->work_w_);
  WebRtc_rdft(n,1,(float *)a,ip,w);
  fVar1 = std::complex<float>::imag_abi_cxx11_((complex<float> *)dest_float);
  std::complex<float>::complex(&local_30,fVar1,0.0);
  *(_ComplexT *)(dest_float + (this->complex_length_ - 1) * 2) = local_30._M_value;
  fVar1 = std::complex<float>::real_abi_cxx11_((complex<float> *)dest_float);
  std::complex<float>::complex(&local_38,fVar1,0.0);
  *(_ComplexT *)dest_float = local_38._M_value;
  anon_unknown_2::Conjugate((complex<float> *)dest_float,this->complex_length_);
  return;
}

Assistant:

void RealFourierOoura::Forward(const float* src, complex<float>* dest) const {
  {
    // This cast is well-defined since C++11. See "Non-static data members" at:
    // http://en.cppreference.com/w/cpp/numeric/complex
    auto dest_float = reinterpret_cast<float*>(dest);
    std::copy(src, src + length_, dest_float);
    WebRtc_rdft(length_, 1, dest_float, work_ip_.get(), work_w_.get());
  }

  // Ooura places real[n/2] in imag[0].
  dest[complex_length_ - 1] = complex<float>(dest[0].imag(), 0.0f);
  dest[0] = complex<float>(dest[0].real(), 0.0f);
  // Ooura returns the conjugate of the usual Fourier definition.
  Conjugate(dest, complex_length_);
}